

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_private.h
# Opt level: O0

void refreshTimeout(redisAsyncContext *ctx)

{
  redisAsyncContext *ctx_local;
  
  if ((((ctx->c).timeout != (timeval *)0x0) &&
      ((ctx->ev).scheduleTimer != (_func_void_void_ptr_timeval *)0x0)) &&
     ((((ctx->c).timeout)->tv_sec != 0 || (((ctx->c).timeout)->tv_usec != 0)))) {
    (*(ctx->ev).scheduleTimer)((ctx->ev).data,*(ctx->c).timeout);
  }
  return;
}

Assistant:

static inline void refreshTimeout(redisAsyncContext *ctx) {
    if (ctx->c.timeout && ctx->ev.scheduleTimer &&
        (ctx->c.timeout->tv_sec || ctx->c.timeout->tv_usec)) {
        ctx->ev.scheduleTimer(ctx->ev.data, *ctx->c.timeout);
    // } else {
    //     printf("Not scheduling timer.. (tmo=%p)\n", ctx->c.timeout);
    //     if (ctx->c.timeout){
    //         printf("tv_sec: %u. tv_usec: %u\n", ctx->c.timeout->tv_sec,
    //                ctx->c.timeout->tv_usec);
    //     }
    }
}